

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O0

enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
toml::find_or<toml::type_config,char[6]>
          (basic_value<toml::type_config> *v,char (*k) [6],basic_value<toml::type_config> *opt)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *this;
  key_type *in_stack_ffffffffffffff98;
  basic_value<toml::type_config> *in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffc8;
  
  detail::key_cast<toml::type_config>(in_stack_ffffffffffffffc8);
  this = find<toml::type_config>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return this;
}

Assistant:

cxx::enable_if_t<detail::is_type_config<TC>::value, basic_value<TC>> const&
find_or(const basic_value<TC>& v, const K& k, const basic_value<TC>& opt) noexcept
{
    try
    {
        return ::toml::find(v, detail::key_cast<TC>(k));
    }
    catch(...)
    {
        return opt;
    }
}